

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EllipsoidRecord1.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EllipsoidRecord1::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EllipsoidRecord1 *this)

{
  ostream *poVar1;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  EllipsoidRecord1 *local_18;
  EllipsoidRecord1 *this_local;
  
  local_18 = this;
  this_local = (EllipsoidRecord1 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tCentroid Location: ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1f0,&this->m_CentLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\tSigma:             ");
  Vector::GetAsString_abi_cxx11_(&local_210,&this->m_Sigma);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\tOrientation:       ");
  EulerAngles::GetAsString_abi_cxx11_(&local_230,&this->m_Ori);
  std::operator<<(poVar1,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EllipsoidRecord1::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tCentroid Location: " << m_CentLocation.GetAsString()
       << "\tSigma:             " << m_Sigma.GetAsString()
       << "\tOrientation:       " << m_Ori.GetAsString();

    return ss.str();
}